

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_hist.c
# Opt level: O0

void show_rate_histogram(rate_hist *hist,aom_codec_enc_cfg_t *cfg,int max_buckets)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int unaff_retaddr;
  int buckets;
  int scale;
  int i;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_8;
  
  local_20 = 0;
  if ((in_RDI != 0) && (in_RSI != 0)) {
    for (local_18 = 0; local_18 < 100; local_18 = local_18 + 1) {
      if (*(int *)(in_RDI + 0x18 + (long)local_18 * 0xc) != 0x7fffffff) {
        puVar1 = (undefined8 *)(in_RDI + 0x18 + (long)local_20 * 0xc);
        puVar2 = (undefined8 *)(in_RDI + 0x18 + (long)local_18 * 0xc);
        *puVar1 = *puVar2;
        *(undefined4 *)(puVar1 + 1) = *(undefined4 *)(puVar2 + 1);
        local_20 = local_20 + 1;
      }
    }
    local_14 = in_EDX;
    local_8 = in_RDI;
    fprintf(_stderr,"\nRate (over %dms window):\n",(ulong)*(uint *)(in_RSI + 0x9c));
    local_1c = merge_hist_buckets((hist_bucket *)(local_8 + 0x18),local_14,&local_20);
    show_histogram((hist_bucket *)CONCAT44(max_buckets,i),scale,buckets,unaff_retaddr);
  }
  return;
}

Assistant:

void show_rate_histogram(struct rate_hist *hist, const aom_codec_enc_cfg_t *cfg,
                         int max_buckets) {
  int i, scale;
  int buckets = 0;

  if (hist == NULL || cfg == NULL) return;

  for (i = 0; i < RATE_BINS; i++) {
    if (hist->bucket[i].low == INT_MAX) continue;
    hist->bucket[buckets++] = hist->bucket[i];
  }

  fprintf(stderr, "\nRate (over %dms window):\n", cfg->rc_buf_sz);
  scale = merge_hist_buckets(hist->bucket, max_buckets, &buckets);
  show_histogram(hist->bucket, buckets, hist->total, scale);
}